

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# external_file_cache.cpp
# Opt level: O3

void __thiscall duckdb::ExternalFileCache::CachedFileRange::VerifyCheckSum(CachedFileRange *this)

{
  return;
}

Assistant:

void ExternalFileCache::CachedFileRange::VerifyCheckSum() {
#ifdef DEBUG
	if (checksum == 0) {
		return;
	}
	auto buffer_handle = block_handle->block_manager.buffer_manager.Pin(block_handle);
	D_ASSERT(checksum == Checksum(buffer_handle.Ptr(), nr_bytes));
#endif
}